

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void __thiscall Tigre::String::String(String *this,int i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  __val = -i;
  if (0 < i) {
    __val = i;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_001025b0;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_001025b0;
      }
      if (uVar2 < 10000) goto LAB_001025b0;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_001025b0:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)(i >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + ((uint)i >> 0x1f),__len,__val);
  std::__cxx11::string::operator=((string *)this,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

Tigre::String::String(int i){
    this->value = std::to_string(i);
}